

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryFileManager::DeleteTemporaryBuffer(TemporaryFileManager *this,block_id_t id)

{
  TemporaryFileIndex index_00;
  mapped_type *pmVar1;
  TemporaryFileManagerLock lock;
  optional_ptr<duckdb::TemporaryFileHandle,_true> handle;
  TemporaryFileIndex index;
  lock_guard<std::mutex> local_38;
  optional_ptr<duckdb::TemporaryFileHandle,_true> local_30;
  TemporaryFileIdentifier local_28;
  optional_idx local_18;
  
  TemporaryFileManagerLock::TemporaryFileManagerLock
            ((TemporaryFileManagerLock *)&local_38,&this->manager_lock);
  local_30.ptr = (TemporaryFileHandle *)id;
  pmVar1 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->used_blocks,(key_type *)&local_30);
  local_18.index = (pmVar1->block_index).index;
  local_28.size = (pmVar1->identifier).size;
  local_28.file_index.index = (pmVar1->identifier).file_index.index;
  local_30 = TemporaryFileMap::GetFile(&this->files,&local_28);
  optional_ptr<duckdb::TemporaryFileHandle,_true>::CheckValid(&local_30);
  index_00.identifier.file_index.index = local_28.file_index.index;
  index_00.identifier.size = local_28.size;
  index_00.block_index.index = local_18.index;
  EraseUsedBlock(this,(TemporaryFileManagerLock *)&local_38,id,local_30.ptr,index_00);
  pthread_mutex_unlock((pthread_mutex_t *)local_38._M_device);
  return;
}

Assistant:

void TemporaryFileManager::DeleteTemporaryBuffer(block_id_t id) {
	TemporaryFileManagerLock lock(manager_lock);
	auto index = GetTempBlockIndex(lock, id);
	auto handle = GetFileHandle(lock, index.identifier);
	EraseUsedBlock(lock, id, *handle, index);
}